

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O2

size_t luaC_separateudata(lua_State *L,int all)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  Table *events;
  Node *pNVar3;
  TValue *pTVar4;
  byte bVar5;
  GCObject *pGVar6;
  size_t sVar7;
  
  pgVar1 = L->l_G;
  sVar7 = 0;
  pGVar2 = (GCObject *)pgVar1->mainthread;
  do {
    while( true ) {
      do {
        pGVar6 = pGVar2;
        pGVar2 = (pGVar6->gch).next;
        if (pGVar2 == (GCObject *)0x0) {
          return sVar7;
        }
        bVar5 = (pGVar2->gch).marked;
      } while (((bVar5 & 8) != 0) || ((bVar5 & 3) == 0 && all == 0));
      events = (pGVar2->h).metatable;
      if ((events != (Table *)0x0) && ((events->flags & 4) == 0)) break;
LAB_0010b5e7:
      (pGVar2->gch).marked = bVar5 | 8;
    }
    pTVar4 = luaT_gettm(events,TM_GC,L->l_G->tmname[2]);
    bVar5 = (pGVar2->gch).marked;
    if (pTVar4 == (TValue *)0x0) goto LAB_0010b5e7;
    pNVar3 = (pGVar2->h).node;
    (pGVar2->gch).marked = bVar5 | 8;
    (pGVar6->gch).next = (pGVar2->gch).next;
    if (pgVar1->tmudata == (GCObject *)0x0) {
      (pGVar2->gch).next = pGVar2;
    }
    else {
      (pGVar2->gch).next = (pgVar1->tmudata->gch).next;
      (pgVar1->tmudata->gch).next = pGVar2;
    }
    sVar7 = (long)&pNVar3[1].i_val.value + sVar7;
    pgVar1->tmudata = pGVar2;
    pGVar2 = pGVar6;
  } while( true );
}

Assistant:

size_t luaC_separateudata (lua_State *L, int all) {
  global_State *g = G(L);
  size_t deadmem = 0;
  GCObject **p = &g->mainthread->next;
  GCObject *curr;
  while ((curr = *p) != NULL) {
    if (!(iswhite(curr) || all) || isfinalized(gco2u(curr)))
      p = &curr->gch.next;  /* don't bother with them */
    else if (fasttm(L, gco2u(curr)->metatable, TM_GC) == NULL) {
      markfinalized(gco2u(curr));  /* don't need finalization */
      p = &curr->gch.next;
    }
    else {  /* must call its gc method */
      deadmem += sizeudata(gco2u(curr));
      markfinalized(gco2u(curr));
      *p = curr->gch.next;
      /* link `curr' at the end of `tmudata' list */
      if (g->tmudata == NULL)  /* list is empty? */
        g->tmudata = curr->gch.next = curr;  /* creates a circular list */
      else {
        curr->gch.next = g->tmudata->gch.next;
        g->tmudata->gch.next = curr;
        g->tmudata = curr;
      }
    }
  }
  return deadmem;
}